

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O3

int pal_temperature_get_success(void)

{
  pal_result pVar1;
  undefined8 in_RAX;
  unsigned_short temperature;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  puts("Execute test pal_temperature_get_success\r");
  uStack_8._6_2_ = -1;
  pVar1 = pal_temperature_get((unsigned_short *)((long)&uStack_8 + 6));
  if (pVar1 == PAL_OK) {
    if (uStack_8._6_2_ != -1) {
      puts("Succeeded\r\n\r");
      return 0;
    }
    puts("pal_temperature_get temperature failed. Expected:different then 0xFF Actual:0xFF\r\n\r");
  }
  else {
    printf("pal_temperature_get return failed. Expected:PAL_OK Actual:%u\r\n\r\n",(ulong)pVar1);
  }
  return 1;
}

Assistant:

int pal_temperature_get_success(void) {
    printf("Execute test pal_temperature_get_success\r\n");
    ///arrange
    unsigned short temperature = 0xFFFF;

    ///act
    pal_result result = pal_temperature_get(&temperature);

    ///assert
    if (result != PAL_OK) {
        printf("pal_temperature_get return failed. Expected:PAL_OK Actual:%u\r\n\r\n", result);
        return 1;
    }
    if (temperature == 0xFFFF) {
        printf("pal_temperature_get temperature failed. Expected:different then 0xFF Actual:0xFF\r\n\r\n");
        return 1;
    }
    printf("Succeeded\r\n\r\n");
    return 0;
}